

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Upsert * sqlite3UpsertDup(sqlite3 *db,Upsert *p)

{
  Expr *p_00;
  sqlite3 *db_00;
  Expr *pTargetWhere;
  sqlite3 *in_RSI;
  Upsert *in_RDI;
  ExprList *unaff_retaddr;
  sqlite3 *in_stack_00000008;
  sqlite3 *in_stack_ffffffffffffffd0;
  undefined8 in_stack_fffffffffffffff8;
  Upsert *pUVar1;
  int flags;
  
  flags = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (in_RSI == (sqlite3 *)0x0) {
    pUVar1 = (Upsert *)0x0;
  }
  else {
    p_00 = (Expr *)sqlite3ExprListDup(in_stack_00000008,unaff_retaddr,flags);
    db_00 = (sqlite3 *)sqlite3ExprDup(in_stack_ffffffffffffffd0,p_00,(int)((ulong)in_RDI >> 0x20));
    pTargetWhere = (Expr *)sqlite3ExprListDup(in_stack_00000008,unaff_retaddr,flags);
    pUVar1 = (Upsert *)sqlite3ExprDup(db_00,p_00,(int)((ulong)in_RDI >> 0x20));
    sqlite3UpsertDup(in_RSI,pUVar1);
    pUVar1 = sqlite3UpsertNew(in_RSI,(ExprList *)pUVar1,pTargetWhere,(ExprList *)db_00,p_00,in_RDI);
  }
  return pUVar1;
}

Assistant:

SQLITE_PRIVATE Upsert *sqlite3UpsertDup(sqlite3 *db, Upsert *p){
  if( p==0 ) return 0;
  return sqlite3UpsertNew(db,
           sqlite3ExprListDup(db, p->pUpsertTarget, 0),
           sqlite3ExprDup(db, p->pUpsertTargetWhere, 0),
           sqlite3ExprListDup(db, p->pUpsertSet, 0),
           sqlite3ExprDup(db, p->pUpsertWhere, 0),
           sqlite3UpsertDup(db, p->pNextUpsert)
         );
}